

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O1

void __thiscall
duckdb_re2::Prog::ConfigurePrefixAccel(Prog *this,string *prefix,bool prefix_foldcase)

{
  byte *pbVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  ulong uVar5;
  long lVar6;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var7;
  uint64_t *__s;
  size_t sVar8;
  ulong uVar9;
  undefined7 in_register_00000011;
  ulong uVar10;
  byte *pbVar11;
  ulong uVar12;
  ushort *puVar13;
  bool bVar14;
  uint16_t nfa [256];
  undefined8 uStack_280;
  ushort local_278 [12];
  byte *local_260;
  ulong local_258;
  byte local_250 [16];
  Prog *local_240;
  ulong local_238 [65];
  
  this->prefix_foldcase_ = prefix_foldcase;
  uVar5 = prefix->_M_string_length;
  this->prefix_size_ = uVar5;
  if ((int)CONCAT71(in_register_00000011,prefix_foldcase) == 0) {
    *(int *)&this->field_11 = (int)*(prefix->_M_dataplus)._M_p;
    if (uVar5 != 1) {
      *(int *)((long)&this->field_11 + 4) =
           (int)(prefix->_M_dataplus)._M_p[prefix->_M_string_length - 1];
    }
  }
  else {
    sVar8 = 9;
    if (uVar5 < 10) {
      sVar8 = this->prefix_size_;
    }
    this->prefix_size_ = sVar8;
    uStack_280 = 0x498e1d;
    std::__cxx11::string::substr((ulong)&local_260,(ulong)prefix);
    uVar5 = local_258;
    uStack_280 = 0x498e32;
    memset(local_238,0,0x200);
    pbVar11 = local_260;
    if (local_258 != 0) {
      uVar9 = 0;
      do {
        pbVar1 = local_260 + uVar9;
        uVar9 = uVar9 + 1;
        puVar13 = (ushort *)((long)local_238 + (ulong)*pbVar1 * 2);
        *puVar13 = *puVar13 | (ushort)(1 << ((byte)uVar9 & 0x1f));
      } while (local_258 != uVar9);
    }
    lVar6 = 0;
    do {
      uVar9 = *(ulong *)((long)local_238 + lVar6 * 2 + 8);
      *(ulong *)((long)local_238 + lVar6 * 2) =
           *(ulong *)((long)local_238 + lVar6 * 2) | 0x1000100010001;
      *(ulong *)((long)local_238 + lVar6 * 2 + 8) = uVar9 | 0x1000100010001;
      lVar6 = lVar6 + 8;
    } while (lVar6 != 0x100);
    local_278[4] = 0;
    local_278[5] = 0;
    local_278[6] = 0;
    local_278[7] = 0;
    local_278[8] = 0;
    local_278[9] = 0;
    local_278[0] = 1;
    local_278[1] = 0;
    local_278[2] = 0;
    local_278[3] = 0;
    if (local_258 != 0) {
      uVar9 = 1;
      do {
        uVar10 = uVar9;
        if (uVar9 == local_258) {
          uVar10 = 9;
        }
        local_278[uVar10] =
             *(short *)((long)&uStack_280 + uVar9 * 2 + 6) * 2 + 1U &
             *(ushort *)((long)local_238 + (ulong)pbVar11[uVar9 - 1] * 2);
        bVar14 = uVar9 != local_258;
        uVar9 = uVar9 + 1;
      } while (bVar14);
      lVar6 = 0x3f;
      if (local_258 != 0) {
        for (; local_258 >> lVar6 == 0; lVar6 = lVar6 + -1) {
        }
      }
      uStack_280 = 0x498efb;
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (pbVar11,pbVar11 + local_258,((uint)lVar6 ^ 0x3f) * 2 ^ 0x7e);
      uStack_280 = 0x498f06;
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_less_iter>
                (pbVar11,pbVar11 + local_258);
    }
    uStack_280 = 0x498f18;
    _Var7 = std::
            __unique<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                      ();
    local_258 = (long)_Var7._M_current - (long)local_260;
    *_Var7._M_current = '\0';
    uStack_280 = 0x498f37;
    __s = (uint64_t *)operator_new__(0x800);
    uStack_280 = 0x498f4e;
    local_240 = this;
    memset(__s,0,0x800);
    if (uVar5 != 0) {
      uVar9 = 0;
      do {
        if (local_258 != 0) {
          uVar3 = local_278[uVar9];
          pbVar11 = local_260;
          do {
            bVar2 = *pbVar11;
            uVar10 = (ulong)bVar2;
            lVar6 = -6;
            puVar13 = local_278;
            do {
              lVar6 = lVar6 + 6;
              uVar4 = *puVar13;
              puVar13 = puVar13 + 1;
            } while (uVar4 != (*(ushort *)((long)local_238 + uVar10 * 2) & uVar3 * 2 + 1));
            uVar12 = lVar6 << ((char)uVar9 * '\x06' & 0x3fU);
            __s[uVar10] = __s[uVar10] | uVar12;
            if ((byte)(bVar2 + 0x9f) < 0x1a) {
              __s[uVar10 - 0x20] = __s[uVar10 - 0x20] | uVar12;
            }
            pbVar11 = pbVar11 + 1;
          } while (pbVar11 != local_260 + local_258);
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 != uVar5);
    }
    lVar6 = 0;
    do {
      uVar5 = (__s + lVar6)[1];
      __s[lVar6] = __s[lVar6] | 0xd80000000000000;
      (__s + lVar6)[1] = uVar5 | 0xd80000000000000;
      lVar6 = lVar6 + 2;
    } while (lVar6 != 0x100);
    (local_240->field_11).prefix_dfa_ = __s;
    if (local_260 != local_250) {
      uStack_280 = 0x49900d;
      operator_delete(local_260);
    }
  }
  return;
}

Assistant:

void Prog::ConfigurePrefixAccel(const std::string& prefix,
                                bool prefix_foldcase) {
  prefix_foldcase_ = prefix_foldcase;
  prefix_size_ = prefix.size();
  if (prefix_foldcase_) {
    // Use PrefixAccel_ShiftDFA().
    // ... and no more than nine bytes of the prefix. (See above for details.)
    prefix_size_ = std::min(prefix_size_, kShiftDFAFinal);
    prefix_dfa_ = BuildShiftDFA(prefix.substr(0, prefix_size_));
  } else if (prefix_size_ != 1) {
    // Use PrefixAccel_FrontAndBack().
    prefix_front_back.prefix_front_ = prefix.front();
	prefix_front_back.prefix_back_ = prefix.back();
  } else {
    // Use memchr(3).
	prefix_front_back.prefix_front_ = prefix.front();
  }
}